

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRevolute::ConstraintsFetch_react(ChLinkRevolute *this,double factor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChBodyFrame *pCVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> *local_60;
  ChMatrix33<double> local_58;
  
  dVar38 = factor * (this->m_cnstr_uw).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar39 = factor * (this->m_cnstr_vw).super_ChConstraintTwo.super_ChConstraint.l_i;
  pCVar37 = (this->super_ChLink).Body2;
  local_68 = &(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  dVar42 = factor * (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar40 = factor * (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar41 = factor * (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar40;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       dVar41 * *(double *)
                 ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar13 = vfmadd231sd_fma(auVar64,auVar57,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar42;
  auVar13 = vfmadd231sd_fma(auVar13,auVar50,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       dVar41 * *(double *)
                 ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar14 = vfmadd231sd_fma(auVar68,auVar57,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar14 = vfmadd231sd_fma(auVar14,auVar50,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       *(double *)
        ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       dVar41 * *(double *)
                 ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar40;
  auVar15 = vfmadd231sd_fma(auVar43,auVar58,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar42;
  auVar15 = vfmadd231sd_fma(auVar15,auVar51,auVar18);
  dVar42 = auVar15._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar15 = vfmadd231sd_fma(auVar52,auVar14,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar15 = vfmadd231sd_fma(auVar15,auVar13,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar16 = vfmadd231sd_fma(auVar59,auVar14,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar16 = vfmadd231sd_fma(auVar16,auVar13,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar14 = vfmadd231sd_fma(auVar44,auVar14,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar13 = vfmadd231sd_fma(auVar14,auVar13,auVar24);
  (this->super_ChLink).react_force.m_data[0] = auVar13._0_8_;
  (this->super_ChLink).react_force.m_data[1] = auVar16._0_8_;
  (this->super_ChLink).react_force.m_data[2] = auVar15._0_8_;
  pCVar37 = (this->super_ChLink).Body1;
  dVar42 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar40 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x18);
  dVar41 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x30);
  dVar1 = (pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
          super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar2 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8
           );
  dVar3 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x10);
  dVar4 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x18);
  dVar5 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x20);
  dVar6 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x28);
  dVar7 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x30);
  dVar8 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x38);
  dVar9 = *(double *)
           ((long)&(pCVar37->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
           0x40);
  dVar10 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 8);
  dVar11 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
  dVar12 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
  local_60 = &this->m_w2_tilde;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_58,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar42;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar7;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar40 * dVar8;
  auVar13 = vfmadd231sd_fma(auVar45,auVar65,auVar69);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar41;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar9;
  auVar13 = vfmadd231sd_fma(auVar13,auVar75,auVar72);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar10;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar11 * dVar8;
  auVar14 = vfmadd231sd_fma(auVar53,auVar77,auVar65);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar12;
  auVar14 = vfmadd231sd_fma(auVar14,auVar78,auVar75);
  dVar42 = dVar38 * auVar13._0_8_ + dVar39 * auVar14._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar2 * dVar40;
  auVar13 = vfmadd231sd_fma(auVar54,auVar79,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar3;
  auVar13 = vfmadd231sd_fma(auVar13,auVar70,auVar72);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar2 * dVar11;
  auVar14 = vfmadd231sd_fma(auVar60,auVar77,auVar79);
  auVar14 = vfmadd231sd_fma(auVar14,auVar78,auVar70);
  dVar41 = dVar38 * auVar13._0_8_ + dVar39 * auVar14._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar4;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar40 * dVar5;
  auVar13 = vfmadd231sd_fma(auVar61,auVar76,auVar69);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar6;
  auVar13 = vfmadd231sd_fma(auVar13,auVar74,auVar72);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar11 * dVar5;
  auVar14 = vfmadd231sd_fma(auVar66,auVar76,auVar77);
  auVar14 = vfmadd231sd_fma(auVar14,auVar74,auVar78);
  dVar40 = dVar38 * auVar13._0_8_ + dVar39 * auVar14._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar41;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       dVar40 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar13 = vfmadd231sd_fma(auVar67,auVar55,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar42;
  auVar13 = vfmadd231sd_fma(auVar13,auVar46,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       dVar40 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar14 = vfmadd231sd_fma(auVar71,auVar55,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar14 = vfmadd231sd_fma(auVar14,auVar46,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar41;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       dVar40 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar15 = vfmadd231sd_fma(auVar62,auVar56,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar42;
  auVar15 = vfmadd231sd_fma(auVar15,auVar47,auVar30);
  dVar42 = auVar15._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar15 = vfmadd231sd_fma(auVar48,auVar14,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar15 = vfmadd231sd_fma(auVar15,auVar13,auVar32);
  auVar49._0_8_ = auVar15._0_8_ ^ 0x8000000000000000;
  auVar49._8_8_ = auVar15._8_8_ ^ 0x8000000000000000;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar15 = vfmadd231sd_fma(auVar73,auVar14,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar15 = vfmadd231sd_fma(auVar15,auVar13,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       dVar42 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar14 = vfmadd231sd_fma(auVar63,auVar14,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar13 = vfmadd231sd_fma(auVar14,auVar13,auVar36);
  auVar13 = vunpcklpd_avx(auVar13,auVar15);
  (this->super_ChLink).react_torque.m_data[0] = -auVar13._0_8_;
  (this->super_ChLink).react_torque.m_data[1] = -auVar13._8_8_;
  dVar42 = (double)vmovlpd_avx(auVar49);
  (this->super_ChLink).react_torque.m_data[2] = dVar42;
  return;
}

Assistant:

void ChLinkRevolute::ConstraintsFetch_react(double factor) {
    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the 2 dot constraint.
    ChVector<> lam_sph(m_cnstr_x.Get_l_i(), m_cnstr_y.Get_l_i(), m_cnstr_z.Get_l_i());
    double lam_uw = m_cnstr_uw.Get_l_i();
    double lam_vw = m_cnstr_vw.Get_l_i();

    // Note that the Lagrange multipliers must be multiplied by 'factor' to
    // convert from reaction impulses to reaction forces.
    lam_sph *= factor;
    lam_uw *= factor;
    lam_vw *= factor;

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the revolute joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(w2') *A_2^T * (u1 * lam_uw + v1 * lam_vw)
    //     = -C^T * [A_2 * tilde(w2')]^T * (u1 * lam_uw + v1 * lam_vw)

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChVector<> v1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Yaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_w2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_uw * u1 + lam_vw * v1);
    react_torque = -(m_frame2.GetA().transpose() * T2);
}